

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O1

int count_obj_list(OBJ_INDEX_DATA *pObjIndex,OBJ_DATA *list)

{
  OBJ_INDEX_DATA **ppOVar1;
  int iVar2;
  OBJ_DATA *obj;
  
  iVar2 = 0;
  if (list != (OBJ_DATA *)0x0) {
    do {
      ppOVar1 = &list->pIndexData;
      list = list->next_content;
      iVar2 = iVar2 + (uint)(*ppOVar1 == pObjIndex);
    } while (list != (OBJ_DATA *)0x0);
  }
  return iVar2;
}

Assistant:

int count_obj_list(OBJ_INDEX_DATA *pObjIndex, OBJ_DATA *list)
{
	OBJ_DATA *obj;
	int nMatch;

	nMatch = 0;

	for (obj = list; obj != nullptr; obj = obj->next_content)
	{
		if (obj->pIndexData == pObjIndex)
			nMatch++;
	}

	return nMatch;
}